

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O0

void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  int iVar1;
  int *piVar2;
  long in_RDX;
  TPZVec<int> *in_RSI;
  int i;
  int ncon;
  TPZShapeData *in_stack_000001a0;
  TPZVec<int> *in_stack_000001a8;
  TPZVec<long> *in_stack_000001b0;
  undefined4 local_20;
  
  TPZShapeHCurl<pzshape::TPZShapeCube>::Initialize
            (in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
  TPZManVector<int,_27>::Resize((TPZManVector<int,_27> *)data,CONCAT44(ncon,i));
  for (local_20 = 0; local_20 < 0x13; local_20 = local_20 + 1) {
    TPZVec<int>::operator[](in_RSI,(long)local_20);
    iVar1 = ComputeNConnectShapeF((int)data,ncon);
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDX + 0x2be0),(long)local_20);
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                       TPZVec<int> &connectorders,
                                       TPZShapeData &data)
{
  TPZShapeHCurl<TSHAPE>::Initialize(ids,connectorders,data);
  constexpr int ncon = TSHAPE::NSides-TSHAPE::NCornerNodes;
  data.fHDivNumConnectShape.Resize(ncon);
  //we need to update the number of filtered hcurl functions
  for (int i = 0; i < ncon; i++){
    data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,connectorders[i]);
  }
}